

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_bpe_session::tokenize
          (llm_tokenizer_bpe_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  size_type sVar8;
  reference pcVar9;
  reference pvVar10;
  long in_RDI;
  llama_token token_multibyte;
  string byte_str;
  const_iterator j;
  llama_token token;
  string str;
  value_type *symbol;
  int i_1;
  llm_symbol *sym_1;
  iterator __end2;
  iterator __begin2;
  vector<llm_symbol,_std::allocator<llm_symbol>_> *__range2;
  string right_token;
  string left_token;
  value_type *right_symbol;
  value_type *left_symbol;
  llm_bigram_bpe bigram;
  int i;
  size_t char_len;
  llm_symbol sym;
  size_t offset;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  word_collection;
  int final_prev_index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000003e0;
  string *in_stack_000003e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  llama_token in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  llm_symbol *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  llama_token in_stack_fffffffffffffd34;
  llama_vocab *in_stack_fffffffffffffd38;
  llama_vocab *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  allocator *paVar11;
  int in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  int local_264;
  ulong in_stack_fffffffffffffda0;
  char src;
  vector<llm_symbol,_std::allocator<llm_symbol>_> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  llama_token in_stack_fffffffffffffdc4;
  undefined1 local_229 [33];
  undefined8 local_208;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  llama_token local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  reference local_1d0;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  index iVar12;
  llm_tokenizer_bpe_session *in_stack_fffffffffffffe40;
  __normal_iterator<llm_symbol_*,_std::vector<llm_symbol,_std::allocator<llm_symbol>_>_> local_1b0;
  long local_1a8;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [36];
  undefined4 local_12c;
  reference local_128;
  reference local_120;
  int local_118;
  int local_114;
  int local_dc;
  size_t local_d8;
  unsigned_long local_d0;
  unsigned_long local_c8;
  int local_c0;
  int local_bc;
  long local_b8;
  unsigned_long local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  ulong local_90;
  int local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  reference local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  undefined1 *local_40;
  undefined1 local_38 [28];
  int local_1c;
  
  local_1c = -1;
  unicode_regex_split(in_stack_000003e8,in_stack_000003e0);
  llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::clear
            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)0x540168);
  local_40 = local_38;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd18);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd18);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd18), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_48);
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
    ::llama_priority_queue
              ((llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                *)0x5401f5);
    llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
    ::operator=((llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                (llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 *)in_stack_fffffffffffffd18);
    llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
    ::~llama_priority_queue
              ((llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                *)0x54021d);
    llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::clear
              ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)0x54022e);
    local_88 = 0;
    local_90 = 0;
    bVar3 = llama_vocab::get_ignore_merges((llama_vocab *)0x540255);
    if ((bVar3) &&
       (in_stack_fffffffffffffdc4 =
             llama_vocab::text_to_token
                       (in_stack_fffffffffffffd38,
                        (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)),
       in_stack_fffffffffffffdc4 != -1)) {
      in_stack_fffffffffffffdb8 = (vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10)
      ;
      local_a8 = 0xffffffff;
      local_a4 = 0xffffffff;
      local_a0 = std::__cxx11::string::c_str();
      local_98 = std::__cxx11::string::size();
      llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::emplace_back<llm_symbol>
                ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28);
      local_90 = std::__cxx11::string::size();
    }
    while( true ) {
      uVar7 = local_90;
      uVar4 = std::__cxx11::string::size();
      src = (char)(in_stack_fffffffffffffda0 >> 0x38);
      if (uVar4 <= uVar7) break;
      lVar5 = std::__cxx11::string::size();
      local_d0 = lVar5 - local_90;
      std::__cxx11::string::operator[]((ulong)local_58);
      local_d8 = unicode_len_utf8(src);
      puVar6 = std::min<unsigned_long>(&local_d0,&local_d8);
      local_c8 = *puVar6;
      local_b8 = std::__cxx11::string::c_str();
      local_b8 = local_b8 + local_90;
      local_b0 = local_c8;
      in_stack_fffffffffffffda0 = local_c8 + local_90;
      local_c0 = local_88 + -1;
      local_90 = in_stack_fffffffffffffda0;
      uVar7 = std::__cxx11::string::size();
      if (in_stack_fffffffffffffda0 == uVar7) {
        local_264 = -1;
      }
      else {
        local_264 = local_88 + 1;
      }
      local_bc = local_264;
      local_88 = local_88 + 1;
      std::vector<llm_symbol,std::allocator<llm_symbol>>::emplace_back<llm_symbol&>
                ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28);
    }
    for (local_dc = 1; iVar2 = local_dc,
        sVar8 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::size
                          ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10)),
        iVar2 < (int)sVar8; local_dc = local_dc + 1) {
      add_new_bigram(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    }
    while (bVar3 = llama_vocab::std::
                   priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                   ::empty((priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                            *)0x54052e), ((bVar3 ^ 0xffU) & 1) != 0) {
      llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ::pop_move((llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                  *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      local_120 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                             (long)local_118);
      local_128 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                             (long)local_114);
      if ((local_120->n == 0) || (local_128->n == 0)) {
        local_12c = 9;
      }
      else {
        pcVar1 = local_120->text;
        uVar7 = local_120->n;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,pcVar1,uVar7,&local_151);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        pcVar1 = local_128->text;
        uVar7 = local_128->n;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,pcVar1,uVar7,&local_179);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd5c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd5c);
        std::__cxx11::string::~string(local_1a0);
        if ((in_stack_fffffffffffffd5c & 0x1000000) == 0) {
          local_120->n = local_128->n + local_120->n;
          local_128->n = 0;
          local_120->next = local_128->next;
          if (-1 < local_128->next) {
            in_stack_fffffffffffffd58 = local_118;
            pvVar10 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                                ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                                 (long)local_128->next);
            pvVar10->prev = in_stack_fffffffffffffd58;
          }
          add_new_bigram(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                         in_stack_fffffffffffffe38);
          add_new_bigram(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                         in_stack_fffffffffffffe38);
          local_12c = 0;
        }
        else {
          local_12c = 9;
        }
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_150);
      }
      llm_bigram_bpe::~llm_bigram_bpe((llm_bigram_bpe *)0x540845);
    }
    local_1a8 = in_RDI + 0x10;
    local_1b0._M_current =
         (llm_symbol *)
         llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::begin
                   ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)in_stack_fffffffffffffd18);
    llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::end
              ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)in_stack_fffffffffffffd18);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<llm_symbol_*,_std::vector<llm_symbol,_std::allocator<llm_symbol>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                              (__normal_iterator<llm_symbol_*,_std::vector<llm_symbol,_std::allocator<llm_symbol>_>_>
                               *)in_stack_fffffffffffffd18), bVar3) {
      in_stack_fffffffffffffe40 =
           (llm_tokenizer_bpe_session *)
           __gnu_cxx::
           __normal_iterator<llm_symbol_*,_std::vector<llm_symbol,_std::allocator<llm_symbol>_>_>::
           operator*(&local_1b0);
      if ((in_stack_fffffffffffffe40->symbols).
          super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        *(int *)&in_stack_fffffffffffffe40->vocab = local_1c;
        *(index *)((long)&in_stack_fffffffffffffe40->vocab + 4) = -1;
        if (local_1c != -1) {
          sVar8 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::size
                            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x28));
          pvVar10 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                              ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x28),
                               (long)local_1c);
          pvVar10->next = (index)sVar8;
        }
        std::vector<llm_symbol,std::allocator<llm_symbol>>::emplace_back<llm_symbol&>
                  ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
        sVar8 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::size
                          ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x28));
        local_1c = (int)sVar8 + -1;
      }
      __gnu_cxx::
      __normal_iterator<llm_symbol_*,_std::vector<llm_symbol,_std::allocator<llm_symbol>_>_>::
      operator++(&local_1b0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator=
            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  bVar3 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::empty
                    ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (!bVar3) {
    iVar12 = 0;
    while (iVar12 != -1) {
      local_1d0 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                            ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                             (long)iVar12);
      if (local_1d0->n != 0) {
        this_00 = (llama_vocab *)local_1d0->text;
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0->n;
        paVar11 = &local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,(char *)this_00,(ulong)this_01,paVar11);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        in_stack_fffffffffffffd34 =
             llama_vocab::text_to_token
                       (this_00,(string *)
                                CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        local_1f8 = in_stack_fffffffffffffd34;
        if (in_stack_fffffffffffffd34 == -1) {
          local_200._M_current = (char *)std::__cxx11::string::begin();
          while( true ) {
            local_208 = std::__cxx11::string::end();
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffd18);
            if (!bVar3) break;
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_200);
            in_stack_fffffffffffffd24 = (int)*pcVar9;
            in_stack_fffffffffffffd28 = (llm_symbol *)local_229;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(size_type)this_00,(char)((uint)in_stack_fffffffffffffd34 >> 0x18),
                       (allocator<char> *)in_stack_fffffffffffffd28);
            std::allocator<char>::~allocator((allocator<char> *)local_229);
            in_stack_fffffffffffffd20 =
                 llama_vocab::text_to_token
                           (this_00,(string *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
            if (in_stack_fffffffffffffd20 != -1) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         &in_stack_fffffffffffffd28->prev);
            }
            std::__cxx11::string::~string((string *)(local_229 + 1));
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_200);
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     &in_stack_fffffffffffffd28->prev);
        }
        std::__cxx11::string::~string(local_1f0);
      }
      pvVar10 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                          ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                           (long)iVar12);
      iVar12 = pvVar10->next;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        int final_prev_index = -1;
        const auto word_collection = unicode_regex_split(text, tokenizer.regex_exprs);

        symbols_final.clear();

        for (const auto & word : word_collection) {
            work_queue = llm_bigram_bpe::queue();
            symbols.clear();

            int index = 0;
            size_t offset = 0;

            //if (vocab.tokenizer_ignore_merges && vocab.token_to_id.find(word) != vocab.token_to_id.end()) {
            if (vocab.get_ignore_merges() && vocab.text_to_token(word) != LLAMA_TOKEN_NULL) {
                symbols.emplace_back(llm_symbol{-1, -1, word.c_str(), word.size()});
                offset = word.size();
            }

            while (offset < word.size()) {
                llm_symbol sym;
                size_t char_len = std::min(word.size() - offset, (size_t) unicode_len_utf8(word[offset]));
                sym.text = word.c_str() + offset;
                sym.n = char_len;
                offset += sym.n;
                sym.prev = index - 1;
                sym.next = offset == word.size() ? -1 : index + 1;
                index++;
                symbols.emplace_back(sym);
            }
            for (int i = 1; i < (int) symbols.size(); ++i) {
                add_new_bigram(i - 1, i);
            }

            // build token(s)
            while (!work_queue.empty()) {
                auto bigram = work_queue.pop_move();

                auto & left_symbol = symbols[bigram.left];
                auto & right_symbol = symbols[bigram.right];

                if (left_symbol.n == 0 || right_symbol.n == 0) {
                    continue;
                }
                std::string left_token = std::string(left_symbol.text, left_symbol.n);
                std::string right_token = std::string(right_symbol.text, right_symbol.n);
                if (left_token + right_token != bigram.text) {
                    continue;  // Skip this bigram if it's outdated
                }

                // merge the right sym into the left one
                left_symbol.n += right_symbol.n;
                right_symbol.n = 0;

                // remove the right sym from the chain
                left_symbol.next = right_symbol.next;
                if (right_symbol.next >= 0) {
                    symbols[right_symbol.next].prev = bigram.left;
                }

                add_new_bigram(left_symbol.prev, bigram.left);  // left side of current symbol
                add_new_bigram(bigram.left, left_symbol.next);  // right side of current symbol
            }

            // add the finished tokens to the final list keeping correct order for next and prev
            for (auto & sym : symbols) {
                if (sym.n > 0) {
                    sym.prev = final_prev_index;
                    sym.next = -1;
                    if (final_prev_index != -1) {
                        symbols_final[final_prev_index].next = symbols_final.size();
                    }
                    symbols_final.emplace_back(sym);
                    final_prev_index = symbols_final.size() - 1;
                }
            }
        }

        symbols = symbols_final;

        if (!symbols.empty()) {
            for (int i = 0; i != -1; i = symbols[i].next) {
                auto & symbol = symbols[i];
                if (symbol.n == 0) {
                    continue;
                }

                const std::string str = std::string(symbol.text, symbol.n);
                const auto token = vocab.text_to_token(str);

                if (token == LLAMA_TOKEN_NULL) {
                    for (auto j = str.begin(); j != str.end(); ++j) {
                        std::string byte_str(1, *j);
                        auto token_multibyte = vocab.text_to_token(byte_str);
                        if (token_multibyte != LLAMA_TOKEN_NULL) {
                            output.push_back(token_multibyte);
                        }
                    }
                } else {
                    output.push_back(token);
                }
            }
        }
    }